

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O1

void asio::detail::
     completion_handler<asio::detail::binder2<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_std::error_code,_unsigned_long>,_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>
  *pbVar1;
  error_code ec;
  ptr p;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>
  handler;
  ptr local_48;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>
  local_30;
  
  local_30.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)base[1].next_;
  pbVar1 = &local_30;
  local_30.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[1].func_;
  base[1].func_ = (func_type)0x0;
  base[1].next_ = (scheduler_operation *)0x0;
  local_30.arg1_._0_8_ = *(undefined8 *)&base[1].task_result_;
  local_30.arg1_._M_cat = (error_category *)base[2].next_;
  local_30.arg2_ = (unsigned_long)base[2].func_;
  local_48.h = pbVar1;
  local_48.v = (completion_handler<asio::detail::binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>,_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_48.p = (completion_handler<asio::detail::binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>,_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  ptr::reset(&local_48);
  if (owner != (void *)0x0) {
    ec._0_8_ = local_30.arg1_._0_8_ & 0xffffffff;
    ec._M_cat = local_30.arg1_._M_cat;
    fineftp::FtpSession::startSendingMessages::anon_class_16_1_3fcf6656::operator()
              (&local_30.handler_,ec,(size_t)pbVar1);
  }
  if (local_30.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_30.handler_.me.
               super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  ptr::reset(&local_48);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }